

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

void helper_vncipher_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  byte *pbVar1;
  long lVar2;
  ppc_avr_t tmp;
  
  pbVar1 = "\x03";
  lVar2 = 0;
  do {
    tmp.u8[lVar2] = AES_isbox[a->u8[0xf - (ulong)*pbVar1]] ^ b->u8[lVar2];
    lVar2 = lVar2 + 1;
    pbVar1 = pbVar1 + -1;
  } while (lVar2 != 0x10);
  lVar2 = 0;
  do {
    r->u32[lVar2] =
         AES_imc[tmp.u8[lVar2 * 4 + 2]][1] ^ AES_imc[tmp.u8[lVar2 * 4 + 3]][0] ^
         AES_imc[tmp.u8[lVar2 * 4 + 1]][2] ^ AES_imc[tmp.u8[lVar2 * 4]][3];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

void helper_vncipher(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    /* This differs from what is written in ISA V2.07.  The RTL is */
    /* incorrect and will be fixed in V2.07B.                      */
    int i;
    ppc_avr_t tmp;

    VECTOR_FOR_INORDER_I(i, u8) {
        tmp.VsrB(i) = b->VsrB(i) ^ AES_isbox[a->VsrB(AES_ishifts[i])];
    }

    VECTOR_FOR_INORDER_I(i, u32) {
        r->VsrW(i) =
            AES_imc[tmp.VsrB(4 * i + 0)][0] ^
            AES_imc[tmp.VsrB(4 * i + 1)][1] ^
            AES_imc[tmp.VsrB(4 * i + 2)][2] ^
            AES_imc[tmp.VsrB(4 * i + 3)][3];
    }
}